

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::MessageOptions::ByteSizeLong(MessageOptions *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  UninterpretedOption *value;
  uint local_40;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  MessageOptions *this_local;
  
  _i = internal::ExtensionSet::ByteSize(&this->_extensions_);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = MessageOptions::unknown_fields(this);
    sVar4 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
    _i = sVar4 + _i;
  }
  uVar2 = uninterpreted_option_size(this);
  _i = (ulong)uVar2 * 2 + _i;
  for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
    value = uninterpreted_option(this,local_40);
    sVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value);
    _i = sVar4 + _i;
  }
  if (((this->_has_bits_).has_bits_[0] & 0xf) != 0) {
    bVar1 = has_message_set_wire_format(this);
    if (bVar1) {
      _i = _i + 2;
    }
    bVar1 = has_no_standard_descriptor_accessor(this);
    if (bVar1) {
      _i = _i + 2;
    }
    bVar1 = has_deprecated(this);
    if (bVar1) {
      _i = _i + 2;
    }
    bVar1 = has_map_entry(this);
    if (bVar1) {
      _i = _i + 2;
    }
  }
  iVar3 = internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t MessageOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MessageOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  {
    unsigned int count = this->uninterpreted_option_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->uninterpreted_option(i));
    }
  }

  if (_has_bits_[0 / 32] & 15u) {
    // optional bool message_set_wire_format = 1 [default = false];
    if (has_message_set_wire_format()) {
      total_size += 1 + 1;
    }

    // optional bool no_standard_descriptor_accessor = 2 [default = false];
    if (has_no_standard_descriptor_accessor()) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (has_deprecated()) {
      total_size += 1 + 1;
    }

    // optional bool map_entry = 7;
    if (has_map_entry()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}